

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t FSE_compress_usingCTable_generic
                 (void *dst,size_t dstSize,void *src,size_t srcSize,FSE_CTable *ct,uint fast)

{
  byte *pbVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  ushort uVar5;
  long lVar7;
  ulong *puVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong *puVar14;
  uint uVar15;
  uint uVar16;
  ushort uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  void *pvVar24;
  ulong *puVar25;
  ulong uVar6;
  
  if ((2 < srcSize) && (8 < dstSize)) {
    puVar8 = (ulong *)((long)dst + (dstSize - 8));
    uVar9 = (ulong)*(byte *)((long)src + (srcSize - 1));
    uVar2 = (ushort)*ct;
    lVar7 = 1;
    if (uVar2 != 0) {
      lVar7 = (long)(1 << ((char)uVar2 - 1U & 0x1f));
    }
    uVar18 = ct[lVar7 + uVar9 * 2 + 2] + 0x8000;
    uVar3 = *(ushort *)
             ((long)ct +
             (long)(int)ct[lVar7 + uVar9 * 2 + 1] * 2 +
             (ulong)((uVar18 & 0xffff0000) - ct[lVar7 + uVar9 * 2 + 2] >>
                    ((byte)(uVar18 >> 0x10) & 0x3f)) * 2 + 4);
    if ((srcSize & 1) == 0) {
      uVar9 = (ulong)*(byte *)((long)src + (srcSize - 2));
      lVar4 = srcSize - 2;
      uVar18 = ct[lVar7 + uVar9 * 2 + 2] + 0x8000;
      uVar17 = *(ushort *)
                ((long)ct +
                (long)(int)ct[lVar7 + uVar9 * 2 + 1] * 2 +
                (ulong)((uVar18 & 0xffff0000) - ct[lVar7 + uVar9 * 2 + 2] >>
                       ((byte)(uVar18 >> 0x10) & 0x3f)) * 2 + 4);
      uVar9 = 0;
      uVar10 = 0;
      puVar14 = (ulong *)dst;
      uVar5 = uVar3;
    }
    else {
      uVar9 = (ulong)*(byte *)((long)src + (srcSize - 2));
      uVar18 = ct[lVar7 + uVar9 * 2 + 2] + 0x8000;
      uVar6 = (ulong)*(byte *)((long)src + (srcSize - 3));
      uVar23 = (ulong)ct[lVar7 + uVar6 * 2 + 2] + (ulong)uVar3;
      if (0x1fffff < uVar23) goto LAB_0010a161;
      uVar5 = *(ushort *)
               ((long)ct +
               (long)(int)ct[lVar7 + uVar9 * 2 + 1] * 2 +
               (ulong)((uVar18 & 0xffff0000) - ct[lVar7 + uVar9 * 2 + 2] >>
                      ((byte)(uVar18 >> 0x10) & 0x3f)) * 2 + 4);
      lVar4 = srcSize - 3;
      uVar18 = BIT_mask[uVar23 >> 0x10] & (uint)uVar3;
      uVar17 = *(ushort *)
                ((long)ct +
                (long)(int)ct[lVar7 + uVar6 * 2 + 1] * 2 +
                (ulong)(uVar3 >> ((byte)(uVar23 >> 0x10) & 0x3f)) * 2 + 4);
      if (fast == 0) {
        if (puVar8 < dst) goto LAB_0010a1be;
        puVar14 = (ulong *)((long)dst + (uVar23 >> 0x13));
        if (puVar8 < puVar14) {
          puVar14 = puVar8;
        }
        *(ulong *)dst = (ulong)uVar18;
      }
      else {
        if (puVar8 < dst) goto LAB_0010a19f;
        *(ulong *)dst = (ulong)uVar18;
        puVar14 = (ulong *)((long)dst + (uVar23 >> 0x13));
      }
      uVar10 = (uint)(uVar23 >> 0x10) & 7;
      uVar9 = (ulong)(uVar18 >> ((byte)((int)(uVar23 >> 0x13) << 3) & 0x3f));
    }
    pvVar24 = (void *)((long)src + lVar4);
    uVar6 = (ulong)uVar5;
    uVar23 = (ulong)uVar17;
    if ((srcSize & 2) == 0) {
      uVar19 = ct[lVar7 + (ulong)*(byte *)((long)pvVar24 - 1) * 2 + 2] + uVar6;
      if (0x1fffff < uVar19) goto LAB_0010a161;
      pbVar1 = (byte *)((long)pvVar24 - 2);
      uVar23 = ct[lVar7 + (ulong)*pbVar1 * 2 + 2] + uVar23;
      if (0x1fffff < uVar23) goto LAB_0010a161;
      iVar11 = uVar10 + (int)(uVar19 >> 0x10);
      uVar18 = (int)(uVar23 >> 0x10) + iVar11;
      if (0x3f < uVar18) {
LAB_0010a180:
        __assert_fail("nbBits + bitC->bitPos < sizeof(bitC->bitContainer) * 8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x5df,"void BIT_addBits(BIT_CStream_t *, size_t, unsigned int)");
      }
      uVar6 = (ulong)*(ushort *)
                      ((long)ct +
                      (long)(int)ct[lVar7 + (ulong)*(byte *)((long)pvVar24 - 1) * 2 + 1] * 2 +
                      (ulong)(uVar5 >> ((byte)(uVar19 >> 0x10) & 0x3f)) * 2 + 4);
      pvVar24 = (void *)((long)pvVar24 - 2);
      uVar9 = (ulong)(BIT_mask[uVar19 >> 0x10] & (uint)uVar5) << (sbyte)uVar10 |
              (ulong)(BIT_mask[uVar23 >> 0x10] & (uint)uVar17) << ((byte)iVar11 & 0x3f) | uVar9;
      uVar23 = (ulong)*(ushort *)
                       ((long)ct +
                       (long)(int)ct[lVar7 + (ulong)*pbVar1 * 2 + 1] * 2 +
                       (ulong)(uVar17 >> ((byte)(uVar23 >> 0x10) & 0x3f)) * 2 + 4);
      if (fast == 0) {
        if (puVar8 < puVar14) goto LAB_0010a1be;
        puVar25 = (ulong *)((ulong)(uVar18 >> 3) + (long)puVar14);
        if (puVar8 < puVar25) {
          puVar25 = puVar8;
        }
        *puVar14 = uVar9;
      }
      else {
        if (puVar8 < puVar14) {
LAB_0010a19f:
          __assert_fail("bitC->ptr <= bitC->endPtr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x5f7,"void BIT_flushBitsFast(BIT_CStream_t *)");
        }
        *puVar14 = uVar9;
        puVar25 = (ulong *)((long)puVar14 + (ulong)(uVar18 >> 3));
      }
      uVar10 = uVar18 & 7;
      uVar9 = uVar9 >> ((byte)uVar18 & 0x38);
      puVar14 = puVar25;
    }
    while( true ) {
      uVar18 = (uint)uVar6;
      if (pvVar24 <= src) break;
      uVar19 = ct[lVar7 + (ulong)*(byte *)((long)pvVar24 - 1) * 2 + 2] + uVar6;
      if (0x1fffff < uVar19) goto LAB_0010a161;
      uVar15 = uVar10 + (int)(uVar19 >> 0x10);
      if (0x3f < uVar15) goto LAB_0010a180;
      uVar20 = ct[lVar7 + (ulong)*(byte *)((long)pvVar24 - 2) * 2 + 2] + uVar23;
      if (0x1fffff < uVar20) goto LAB_0010a161;
      uVar12 = uVar15 + (int)(uVar20 >> 0x10);
      if (0x3f < uVar12) goto LAB_0010a180;
      uVar3 = *(ushort *)
               ((long)ct +
               (long)(int)ct[lVar7 + (ulong)*(byte *)((long)pvVar24 - 1) * 2 + 1] * 2 +
               (uVar6 >> ((byte)(uVar19 >> 0x10) & 0x3f)) * 2 + 4);
      uVar21 = (ulong)ct[lVar7 + (ulong)*(byte *)((long)pvVar24 - 3) * 2 + 2] + (ulong)uVar3;
      if (0x1fffff < uVar21) goto LAB_0010a161;
      uVar16 = uVar12 + (int)(uVar21 >> 0x10);
      if (0x3f < uVar16) goto LAB_0010a180;
      uVar17 = *(ushort *)
                ((long)ct +
                (long)(int)ct[lVar7 + (ulong)*(byte *)((long)pvVar24 - 2) * 2 + 1] * 2 +
                (uVar23 >> ((byte)(uVar20 >> 0x10) & 0x3f)) * 2 + 4);
      uVar22 = (ulong)ct[lVar7 + (ulong)*(byte *)((long)pvVar24 - 4) * 2 + 2] + (ulong)uVar17;
      if (0x1fffff < uVar22) goto LAB_0010a161;
      uVar13 = uVar16 + (int)(uVar22 >> 0x10);
      if (0x3f < uVar13) goto LAB_0010a180;
      uVar6 = (ulong)*(ushort *)
                      ((long)ct +
                      (long)(int)ct[lVar7 + (ulong)*(byte *)((long)pvVar24 - 3) * 2 + 1] * 2 +
                      (ulong)(uVar3 >> ((byte)(uVar21 >> 0x10) & 0x3f)) * 2 + 4);
      uVar9 = (ulong)(BIT_mask[uVar19 >> 0x10] & uVar18) << (sbyte)uVar10 | uVar9 |
              (ulong)(BIT_mask[uVar20 >> 0x10] & (uint)uVar23) << ((byte)uVar15 & 0x3f) |
              (ulong)(BIT_mask[uVar21 >> 0x10] & (uint)uVar3) << ((byte)uVar12 & 0x3f) |
              (ulong)(BIT_mask[uVar22 >> 0x10] & (uint)uVar17) << ((byte)uVar16 & 0x3f);
      uVar23 = (ulong)*(ushort *)
                       ((long)ct +
                       (long)(int)ct[lVar7 + (ulong)*(byte *)((long)pvVar24 - 4) * 2 + 1] * 2 +
                       (ulong)(uVar17 >> ((byte)(uVar22 >> 0x10) & 0x3f)) * 2 + 4);
      if (fast == 0) {
        if (puVar8 < puVar14) goto LAB_0010a1be;
        *puVar14 = uVar9;
        puVar14 = (ulong *)((long)puVar14 + (ulong)(uVar13 >> 3));
        if (puVar8 < puVar14) {
          puVar14 = puVar8;
        }
      }
      else {
        if (puVar8 < puVar14) goto LAB_0010a19f;
        *puVar14 = uVar9;
        puVar14 = (ulong *)((long)puVar14 + (ulong)(uVar13 >> 3));
      }
      pvVar24 = (void *)((long)pvVar24 - 4);
      uVar10 = uVar13 & 7;
      uVar9 = uVar9 >> ((byte)uVar13 & 0x38);
    }
    if (0x1f < uVar2) {
LAB_0010a161:
      __assert_fail("nbBits < BIT_MASK_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x5de,"void BIT_addBits(BIT_CStream_t *, size_t, unsigned int)");
    }
    if (puVar8 < puVar14) {
LAB_0010a1be:
      __assert_fail("bitC->ptr <= bitC->endPtr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x607,"void BIT_flushBits(BIT_CStream_t *)");
    }
    uVar15 = BIT_mask[uVar2];
    uVar9 = (ulong)(uVar18 & uVar15) << (sbyte)uVar10 | uVar9;
    *puVar14 = uVar9;
    uVar10 = uVar10 + uVar2;
    puVar14 = (ulong *)((ulong)(uVar10 >> 3) + (long)puVar14);
    if (puVar8 < puVar14) {
      puVar14 = puVar8;
    }
    uVar18 = (uint)uVar2 + (uVar10 & 7);
    uVar9 = (ulong)((uint)uVar23 & uVar15) << (sbyte)(uVar10 & 7) | uVar9 >> ((byte)uVar10 & 0x38);
    puVar25 = (ulong *)((ulong)(uVar18 >> 3) + (long)puVar14);
    if (puVar8 < puVar25) {
      puVar25 = puVar8;
    }
    *puVar14 = uVar9;
    uVar10 = (uVar18 & 7) + 1;
    *puVar25 = uVar9 >> ((byte)uVar18 & 0x38) | 1L << (uVar18 & 7);
    puVar25 = (ulong *)((ulong)(uVar10 >> 3) + (long)puVar25);
    if (puVar8 < puVar25) {
      puVar25 = puVar8;
    }
    if (puVar25 < puVar8) {
      return (long)puVar25 - ((long)dst + ((ulong)((uVar10 & 7) == 0) - 1));
    }
  }
  return 0;
}

Assistant:

static size_t FSE_compress_usingCTable_generic (void* dst, size_t dstSize,
                           const void* src, size_t srcSize,
                           const FSE_CTable* ct, const unsigned fast)
{
    const BYTE* const istart = (const BYTE*) src;
    const BYTE* const iend = istart + srcSize;
    const BYTE* ip=iend;

    BIT_CStream_t bitC;
    FSE_CState_t CState1, CState2;

    /* init */
    if (srcSize <= 2) return 0;
    { size_t const initError = BIT_initCStream(&bitC, dst, dstSize);
      if (FSE_isError(initError)) return 0; /* not enough space available to write a bitstream */ }

#define FSE_FLUSHBITS(s)  (fast ? BIT_flushBitsFast(s) : BIT_flushBits(s))

    if (srcSize & 1) {
        FSE_initCState2(&CState1, ct, *--ip);
        FSE_initCState2(&CState2, ct, *--ip);
        FSE_encodeSymbol(&bitC, &CState1, *--ip);
        FSE_FLUSHBITS(&bitC);
    } else {
        FSE_initCState2(&CState2, ct, *--ip);
        FSE_initCState2(&CState1, ct, *--ip);
    }

    /* join to mod 4 */
    srcSize -= 2;
    if ((sizeof(bitC.bitContainer)*8 > FSE_MAX_TABLELOG*4+7 ) && (srcSize & 2)) {  /* test bit 2 */
        FSE_encodeSymbol(&bitC, &CState2, *--ip);
        FSE_encodeSymbol(&bitC, &CState1, *--ip);
        FSE_FLUSHBITS(&bitC);
    }

    /* 2 or 4 encoding per loop */
    while ( ip>istart ) {

        FSE_encodeSymbol(&bitC, &CState2, *--ip);

        if (sizeof(bitC.bitContainer)*8 < FSE_MAX_TABLELOG*2+7 )   /* this test must be static */
            FSE_FLUSHBITS(&bitC);

        FSE_encodeSymbol(&bitC, &CState1, *--ip);

        if (sizeof(bitC.bitContainer)*8 > FSE_MAX_TABLELOG*4+7 ) {  /* this test must be static */
            FSE_encodeSymbol(&bitC, &CState2, *--ip);
            FSE_encodeSymbol(&bitC, &CState1, *--ip);
        }

        FSE_FLUSHBITS(&bitC);
    }

    FSE_flushCState(&bitC, &CState2);
    FSE_flushCState(&bitC, &CState1);
    return BIT_closeCStream(&bitC);
}